

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcStair::IfcStair(IfcStair *this)

{
  IfcStair *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcStair");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00f9ee30);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>,
             &PTR_construction_vtable_24__00f9ef68);
  *(undefined8 *)this = 0xf9ed00;
  *(undefined8 *)&this->field_0x178 = 0xf9ee18;
  *(undefined8 *)&this->field_0x88 = 0xf9ed28;
  *(undefined8 *)&this->field_0x98 = 0xf9ed50;
  *(undefined8 *)&this->field_0xd0 = 0xf9ed78;
  *(undefined8 *)&this->field_0x100 = 0xf9eda0;
  *(undefined8 *)&this->field_0x138 = 0xf9edc8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0xf9edf0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStair,_1UL>).field_0x10);
  return;
}

Assistant:

IfcStair() : Object("IfcStair") {}